

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnDiskIndex.cpp
# Opt level: O0

uint64_t find_max_batch(vector<IndexMergeHelper,_std::allocator<IndexMergeHelper>_> *indexes,
                       uint32_t trigram,uint64_t max_bytes)

{
  bool bVar1;
  reference this;
  uint64_t uVar2;
  ulong in_RDX;
  int in_ESI;
  undefined8 in_RDI;
  IndexMergeHelper *ndx;
  const_iterator __end2;
  const_iterator __begin2;
  vector<IndexMergeHelper,_std::allocator<IndexMergeHelper>_> *__range2;
  uint64_t batch_bytes;
  int i;
  vector<IndexMergeHelper,_std::allocator<IndexMergeHelper>_> *in_stack_ffffffffffffff98;
  OnDiskRun in_stack_ffffffffffffffa0;
  __normal_iterator<const_IndexMergeHelper_*,_std::vector<IndexMergeHelper,_std::allocator<IndexMergeHelper>_>_>
  local_40;
  undefined8 local_38;
  ulong local_30;
  int local_24;
  ulong local_20;
  int local_14;
  undefined8 local_10;
  
  local_24 = 1;
  local_20 = in_RDX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  while( true ) {
    if (0xffffff < (uint)(local_14 + local_24)) {
      return (ulong)(0x1000000 - local_14);
    }
    local_30 = 0;
    local_38 = local_10;
    local_40._M_current =
         (IndexMergeHelper *)
         std::vector<IndexMergeHelper,_std::allocator<IndexMergeHelper>_>::begin
                   (in_stack_ffffffffffffff98);
    std::vector<IndexMergeHelper,_std::allocator<IndexMergeHelper>_>::end(in_stack_ffffffffffffff98)
    ;
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_IndexMergeHelper_*,_std::vector<IndexMergeHelper,_std::allocator<IndexMergeHelper>_>_>
                               *)in_stack_ffffffffffffffa0.start_,
                              (__normal_iterator<const_IndexMergeHelper_*,_std::vector<IndexMergeHelper,_std::allocator<IndexMergeHelper>_>_>
                               *)in_stack_ffffffffffffff98), bVar1) {
      this = __gnu_cxx::
             __normal_iterator<const_IndexMergeHelper_*,_std::vector<IndexMergeHelper,_std::allocator<IndexMergeHelper>_>_>
             ::operator*(&local_40);
      in_stack_ffffffffffffffa0 =
           IndexMergeHelper::run
                     (this,in_stack_ffffffffffffffa0.end_._4_4_,in_stack_ffffffffffffffa0.start_);
      uVar2 = OnDiskRun::size((OnDiskRun *)&stack0xffffffffffffffa0);
      local_30 = uVar2 + local_30;
      __gnu_cxx::
      __normal_iterator<const_IndexMergeHelper_*,_std::vector<IndexMergeHelper,_std::allocator<IndexMergeHelper>_>_>
      ::operator++(&local_40);
    }
    if (local_20 < local_30) break;
    local_24 = local_24 + 1;
  }
  return (long)(local_24 + -1);
}

Assistant:

uint64_t find_max_batch(const std::vector<IndexMergeHelper> &indexes,
                        uint32_t trigram, uint64_t max_bytes) {
    for (int i = 1; trigram + i < NUM_TRIGRAMS; i++) {
        uint64_t batch_bytes = 0;
        for (const auto &ndx : indexes) {
            batch_bytes += ndx.run(trigram, i).size();
        }
        if (batch_bytes > max_bytes) {
            return i - 1;
        }
    }
    return NUM_TRIGRAMS - trigram;
}